

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLFunctionLoader.cpp
# Opt level: O0

void __thiscall eglu::GLLibraryCache::~GLLibraryCache(GLLibraryCache *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator i;
  GLLibraryCache *this_local;
  
  i._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_tcu::FunctionLibrary_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>_>
       ::begin(&this->m_libraries);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_tcu::FunctionLibrary_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>_>
         ::end(&this->m_libraries);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>::
             operator->(&local_18);
    if (ppVar2->second != (FunctionLibrary *)0x0) {
      (*ppVar2->second->_vptr_FunctionLibrary[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>::operator++
              (&local_18);
  }
  std::
  map<unsigned_int,_tcu::FunctionLibrary_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>_>
  ::~map(&this->m_libraries);
  return;
}

Assistant:

GLLibraryCache::~GLLibraryCache (void)
{
	for (LibraryMap::iterator i = m_libraries.begin(); i != m_libraries.end(); ++i)
		delete i->second;
}